

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_d26c95::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  string *name;
  string_view value;
  string_view value_00;
  string local_a8;
  optional<cmList> list;
  vector<int,_std::allocator<int>_> indexes;
  int index;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)pbVar1) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&list,"sub-command GET requires at least three arguments.",
               (allocator<char> *)&local_a8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&list);
    bVar3 = false;
  }
  else {
    name = pbVar2 + -1;
    GetList(&list,pbVar1 + 1,status->Makefile);
    if (list.super__Optional_base<cmList,_false,_false>._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _M_engaged == false) {
      bVar3 = true;
      value._M_str = "NOTFOUND";
      value._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value);
    }
    else if (list.super__Optional_base<cmList,_false,_false>._M_payload.
             super__Optional_payload<cmList,_true,_false,_false>.
             super__Optional_payload_base<cmList>._M_payload._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             list.super__Optional_base<cmList,_false,_false>._M_payload.
             super__Optional_payload<cmList,_true,_false,_false>.
             super__Optional_payload_base<cmList>._M_payload._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"GET given empty list",(allocator<char> *)&indexes);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&local_a8);
      bVar3 = false;
    }
    else {
      indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lVar4 = 0x40;
      for (uVar5 = 2;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar5 < ((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U;
          uVar5 = uVar5 + 1) {
        bVar3 = GetIndexArg((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),&index,
                            status->Makefile);
        if (!bVar3) {
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                    (&local_a8,(char (*) [8])0x6c38d4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar4),(char (*) [22])0x70517e);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_a8);
          bVar3 = false;
          goto LAB_0031c748;
        }
        std::vector<int,_std::allocator<int>_>::push_back(&indexes,&index);
        lVar4 = lVar4 + 0x20;
      }
      cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((cmList *)&index,(cmList *)&list,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      this = status->Makefile;
      cmList::to_string_abi_cxx11_(&local_a8,(cmList *)&index);
      value_00._M_str = local_a8._M_dataplus._M_p;
      value_00._M_len = local_a8._M_string_length;
      cmMakefile::AddDefinition(this,name,value_00);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&index);
      bVar3 = true;
LAB_0031c748:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&indexes.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::_Optional_payload_base<cmList>::_M_reset((_Optional_payload_base<cmList> *)&list);
  }
  return bVar3;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());
  if (!list) {
    status.GetMakefile().AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (list->empty()) {
    status.SetError("GET given empty list");
    return false;
  }

  std::vector<int> indexes;
  for (std::size_t cc = 2; cc < args.size() - 1; cc++) {
    int index;
    if (!GetIndexArg(args[cc], &index, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    indexes.push_back(index);
  }

  try {
    auto values = list->get_items(indexes.begin(), indexes.end());
    status.GetMakefile().AddDefinition(variableName, values.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}